

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlBufferWriteQuotedString(xmlBufferPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  int len;
  long lVar2;
  
  if ((buf != (xmlBufferPtr)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
    pxVar1 = xmlStrchr(string,'\"');
    if (pxVar1 == (xmlChar *)0x0) {
      if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
        xmlBufferAdd(buf,"\"",-1);
      }
      if ((string != (xmlChar *)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
        len = -1;
LAB_00188ab5:
        xmlBufferAdd(buf,string,len);
      }
LAB_00188aba:
      if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
        pxVar1 = "\"";
        goto LAB_00188b16;
      }
    }
    else {
      pxVar1 = xmlStrchr(string,'\'');
      if (pxVar1 != (xmlChar *)0x0) {
        if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
          xmlBufferAdd(buf,"\"",-1);
        }
        do {
          lVar2 = 0;
          while( true ) {
            len = (int)lVar2;
            if (string[lVar2] == '\0') {
              if (lVar2 != 0) goto LAB_00188ab5;
              goto LAB_00188aba;
            }
            if (string[lVar2] == '\"') break;
            lVar2 = lVar2 + 1;
          }
          if (lVar2 != 0) {
            xmlBufferAdd(buf,string,len);
          }
          xmlBufferAdd(buf,(xmlChar *)"&quot;",6);
          string = string + lVar2 + 1;
        } while( true );
      }
      if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
        xmlBufferAdd(buf,"\'",-1);
      }
      if ((string != (xmlChar *)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
        xmlBufferAdd(buf,string,-1);
      }
      if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
        pxVar1 = "\'";
LAB_00188b16:
        xmlBufferAdd(buf,pxVar1,-1);
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlBufferWriteQuotedString(xmlBufferPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if (buf == NULL)
        return;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return;
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
#ifdef DEBUG_BUFFER
	    xmlGenericError(xmlGenericErrorContext,
 "xmlBufferWriteQuotedString: string contains quote and double-quotes !\n");
#endif
	    xmlBufferCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufferAdd(buf, base, cur - base);
                    xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufferAdd(buf, base, cur - base);
	    xmlBufferCCat(buf, "\"");
	}
        else{
	    xmlBufferCCat(buf, "\'");
            xmlBufferCat(buf, string);
	    xmlBufferCCat(buf, "\'");
        }
    } else {
        xmlBufferCCat(buf, "\"");
        xmlBufferCat(buf, string);
        xmlBufferCCat(buf, "\"");
    }
}